

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O2

void __thiscall PixelToaster::UnixDisplay::handleEvent(UnixDisplay *this,XEvent *event)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar8;
  undefined4 extraout_var_02;
  long *plVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  code *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 *puVar10;
  undefined8 uVar11;
  UnixDisplay *pUVar7;
  undefined4 extraout_var_03;
  
  iVar2 = event->type;
  if (1 < iVar2 - 2U) {
    if (iVar2 - 4U < 2) {
      iVar3 = (event->xkey).x;
      uVar4 = (event->xkey).keycode;
      uVar4 = (uint)CONCAT12(uVar4 == 3,CONCAT11(uVar4 == 2,uVar4 == 1));
      iVar5 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                        (this);
      if (iVar2 == 4) {
        if (CONCAT44(extraout_var_02,iVar5) == 0) {
          return;
        }
        iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                          (this);
        plVar9 = (long *)CONCAT44(extraout_var_03,iVar2);
        iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          (this);
        if (CONCAT44(extraout_var_04,iVar2) != 0) {
          uVar6 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10]
                  )(this);
          this = (UnixDisplay *)(ulong)uVar6;
        }
        uVar11 = CONCAT44((float)iVar3,uVar4);
        UNRECOVERED_JUMPTABLE = *(code **)(*plVar9 + 0x30);
      }
      else {
        if (CONCAT44(extraout_var_02,iVar5) == 0) {
          return;
        }
        iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                          (this);
        plVar9 = (long *)CONCAT44(extraout_var_08,iVar2);
        iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          (this);
        if (CONCAT44(extraout_var_09,iVar2) != 0) {
          uVar6 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10]
                  )(this);
          this = (UnixDisplay *)(ulong)uVar6;
        }
        uVar11 = CONCAT44((float)iVar3,uVar4);
        UNRECOVERED_JUMPTABLE = *(code **)(*plVar9 + 0x38);
      }
    }
    else {
      if (iVar2 != 6) {
        if (iVar2 != 0x21) {
          return;
        }
        if ((event->xkey).root != this->wmProtocols_) {
          return;
        }
        if ((event->xexpose).width != 0x20) {
          return;
        }
        if ((event->xkey).time != this->wmDeleteWindow_) {
          return;
        }
        iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                          (this);
        if (CONCAT44(extraout_var,iVar2) != 0) {
          iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                            (this);
          iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10]
                  )(this);
          pUVar7 = this;
          if (CONCAT44(extraout_var_01,iVar3) != 0) {
            uVar4 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                      [0x10])(this,this);
            pUVar7 = (UnixDisplay *)(ulong)uVar4;
          }
          cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x58))
                            ((long *)CONCAT44(extraout_var_00,iVar2),pUVar7);
          if (cVar1 == '\0') {
            return;
          }
        }
        this->isShuttingDown_ = true;
        return;
      }
      iVar2 = (event->xkey).x;
      uVar4 = (event->xkey).state;
      iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                        (this);
      if (CONCAT44(extraout_var_05,iVar3) == 0) {
        return;
      }
      iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                        (this);
      plVar9 = (long *)CONCAT44(extraout_var_06,iVar3);
      iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                        (this);
      if (CONCAT44(extraout_var_07,iVar3) != 0) {
        uVar6 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          (this);
        this = (UnixDisplay *)(ulong)uVar6;
      }
      uVar11 = CONCAT44((float)iVar2,(uVar4 & 0x400) << 6 | uVar4 >> 1 & 0x100 | uVar4 >> 8 & 1);
      UNRECOVERED_JUMPTABLE = *(code **)(*plVar9 + 0x40);
    }
    (*UNRECOVERED_JUMPTABLE)(plVar9,this,uVar11);
    return;
  }
  uVar4 = 0;
  uVar8 = XkbKeycodeToKeysym(this->display_,(event->xmotion).is_hint,0,0);
  if ((char)(uVar8 >> 8) == '\0') {
    puVar10 = &normalKeys_;
LAB_00109978:
    uVar4 = puVar10[uVar8 & 0xff];
  }
  else if (((uint)(uVar8 >> 8) & 0xff) == 0xff) {
    puVar10 = &functionKeys_;
    goto LAB_00109978;
  }
  uVar8 = (ulong)uVar4;
  if (event->type != 2) {
    (&keyIsReleased_)[uVar8] = 1;
    return;
  }
  if ((&keyIsPressed_)[uVar8] == '\0') {
    iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])(this)
    ;
    if (CONCAT44(extraout_var_10,iVar2) != 0) {
      iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                        (this);
      iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                        (this);
      pUVar7 = this;
      if (CONCAT44(extraout_var_12,iVar3) != 0) {
        uVar6 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          (this,this);
        pUVar7 = (UnixDisplay *)(ulong)uVar6;
      }
      (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar2) + 0x18))
                ((long *)CONCAT44(extraout_var_11,iVar2),pUVar7,uVar8);
      iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                        (this);
      cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar2) + 0x10))
                        ((long *)CONCAT44(extraout_var_13,iVar2));
      if (cVar1 == '\0') goto LAB_00109a05;
    }
    if (uVar4 == 0x1b) {
      this->isShuttingDown_ = true;
    }
  }
LAB_00109a05:
  (&keyIsPressed_)[uVar8] = 1;
  (&keyIsReleased_)[uVar8] = 0;
  return;
}

Assistant:

void handleEvent(const ::XEvent& event)
    {
        switch (event.type)
        {
            case KeyPress:
            case KeyRelease:
            {
                const KeySym keySym = ::XkbKeycodeToKeysym(display_, event.xkey.keycode, 0, 0);
                const int    hiSym  = (keySym & 0xff00) >> 8;
                const int    loSym  = keySym & 0xff;

                Key key = Key::Undefined;
                switch (hiSym)
                {
                    case 0x00:
                        key = normalKeys_[loSym];
                        break;
                    case 0xff:
                        key = functionKeys_[loSym];
                        break;
                }

                if (event.type == KeyPress)
                {
                    if (!keyIsPressed_[key])
                    {
                        bool defaultKeyHandlers = true;

                        if (listener())
                        {
                            listener()->onKeyDown(wrapper() ? *wrapper() : *(DisplayInterface*)this, key);
                            defaultKeyHandlers = listener()->defaultKeyHandlers();
                        }

                        if (defaultKeyHandlers && key == Key::Escape)
                        {
                            isShuttingDown_ = true;
                        }
                    }
                    keyIsPressed_[key]  = true;
                    keyIsReleased_[key] = false;
                }
                else
                {
                    keyIsReleased_[key] = true;
                }
                break;
            }

            case ButtonPress:
            case ButtonRelease:
            {
                Mouse mouse;
                mouse.x              = static_cast<float>(event.xbutton.x);
                mouse.y              = static_cast<float>(event.xbutton.y);
                mouse.buttons.left   = event.xbutton.button == Button1;
                mouse.buttons.middle = event.xbutton.button == Button2;
                mouse.buttons.right  = event.xbutton.button == Button3;
                if (event.type == ButtonPress)
                {
                    if (listener())
                        listener()->onMouseButtonDown(wrapper() ? *wrapper() : *(DisplayInterface*)this, mouse);
                }
                else
                {
                    if (listener())
                        listener()->onMouseButtonUp(wrapper() ? *wrapper() : *(DisplayInterface*)this, mouse);
                }
                break;
            }
            case MotionNotify:
            {
                Mouse mouse;
                mouse.x              = static_cast<float>(event.xmotion.x);
                mouse.y              = static_cast<float>(event.xmotion.y);
                mouse.buttons.left   = event.xmotion.state & Button1Mask;
                mouse.buttons.middle = event.xmotion.state & Button2Mask;
                mouse.buttons.right  = event.xmotion.state & Button3Mask;
                if (listener())
                    listener()->onMouseMove(wrapper() ? *wrapper() : *(DisplayInterface*)this, mouse);
                break;
            }
            case ClientMessage:
            {
                if (event.xclient.message_type == wmProtocols_ &&
                    event.xclient.format == 32 &&
                    event.xclient.data.l[0] == (long)wmDeleteWindow_)
                {
                    if (listener())
                    {
                        if (listener()->onClose(wrapper() ? *wrapper() : *(DisplayInterface*)this))
                            isShuttingDown_ = true;
                    }
                    else
                    {
                        isShuttingDown_ = true;
                    }
                }
                break;
            }
        }
    }